

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void buffer_suite::test_vector(void)

{
  vector<char,_std::allocator<char>_> result;
  string expected;
  undefined4 local_40;
  int local_3c;
  encoder_type encoder;
  
  encoder.storage._8_8_ = &result;
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  encoder.storage._0_8_ = &PTR__base_00118c60;
  local_3c = 0x2a;
  expected._M_dataplus._M_p =
       (pointer)trial::protocol::json::detail::basic_encoder<char,_24UL>::integral_value<int>
                          (&encoder,&local_3c);
  local_40 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(42)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x39,"void buffer_suite::test_vector()",&expected,&local_40);
  expected._M_dataplus._M_p = (pointer)&expected.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&expected,"42","");
  boost::detail::
  test_all_eq_impl<std::ostream,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c,"void buffer_suite::test_vector()",
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )expected._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(expected._M_dataplus._M_p + expected._M_string_length));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected._M_dataplus._M_p != &expected.field_2) {
    operator_delete(expected._M_dataplus._M_p,expected.field_2._M_allocated_capacity + 1);
  }
  (**(code **)encoder.storage._0_8_)();
  if (result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fail_comma()
{
    std::array<char, 0> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::value_separator>(), 0);
}